

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

bool __thiscall QMdiSubWindow::eventFilter(QMdiSubWindow *this,QObject *object,QEvent *event)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  QMdiSubWindowPrivate *this_00;
  long lVar4;
  QWidgetData *pQVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  Representation RVar9;
  Representation RVar10;
  Representation RVar11;
  bool bVar12;
  undefined1 uVar13;
  char cVar14;
  bool bVar15;
  SubControl SVar16;
  int iVar17;
  WindowStates WVar18;
  QSizeGrip *pQVar19;
  QPoint QVar20;
  Data *pDVar21;
  QObject *pQVar22;
  QWidget *pQVar23;
  QAction *pQVar24;
  QWidget *pQVar25;
  int iVar26;
  QMouseEvent *mouseEvent;
  long in_FS_OFFSET;
  QPointF QVar27;
  QLatin1StringView s;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QPoint local_40;
  long local_38;
  QArrayDataPointer<char16_t> *pt;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (object == (QObject *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      object = (QObject *)0x0;
      goto LAB_0041aa79;
    }
    goto LAB_0041af19;
  }
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  bVar12 = QPointer::operator_cast_to_bool((QPointer *)&this_00->systemMenu);
  if (bVar12) {
    pDVar21 = (this_00->systemMenu).wp.d;
    if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
      pQVar22 = (QObject *)0x0;
    }
    else {
      pQVar22 = (this_00->systemMenu).wp.value;
    }
    if (pQVar22 != object) goto LAB_0041a8eb;
    sVar1 = *(short *)(event + 8);
    if (sVar1 == 0x12) {
      this_00->activeSubControl = SC_None;
      pQVar5 = (this->super_QWidget).data;
      iVar26 = (pQVar5->crect).x2.m_i;
      iVar2 = (pQVar5->crect).x1.m_i;
      iVar17 = QMdiSubWindowPrivate::titleBarHeight(this_00);
      QRegion::QRegion((QRegion *)&local_58,0,0,(iVar26 - iVar2) + 1,iVar17,Rectangle);
      QWidget::update(&this->super_QWidget,(QRegion *)&local_58);
      QRegion::~QRegion((QRegion *)&local_58);
    }
    else if (sVar1 == 5) {
      QVar27 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
      local_58.d = (Data *)QVar27.xp;
      local_58.ptr = (char16_t *)QVar27.yp;
      local_40 = QPointF::toPoint((QPointF *)&local_58);
      local_70.d = (Data *)QWidget::mapFromGlobal(&this->super_QWidget,&local_40);
      SVar16 = QMdiSubWindowPrivate::getSubControl(this_00,(QPoint *)&local_70);
      this_00->hoveredSubControl = SVar16;
    }
    else if (sVar1 == 4) {
      if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
        pQVar22 = (QObject *)0x0;
      }
      else {
        pQVar22 = (this_00->systemMenu).wp.value;
      }
      QVar27 = QSinglePointEvent::position((QSinglePointEvent *)event);
      local_58.d = (Data *)QVar27.xp;
      local_58.ptr = (char16_t *)QVar27.yp;
      local_70.d = (Data *)QPointF::toPoint((QPointF *)&local_58);
      pt = &local_70;
      pQVar24 = QMenu::actionAt((QMenu *)pQVar22,(QPoint *)pt);
      iVar26 = (int)pt;
      if ((pQVar24 == (QAction *)0x0) || (cVar14 = QAction::isEnabled(), cVar14 != '\0')) {
        QWidget::close(&this->super_QWidget,iVar26);
      }
    }
    goto LAB_0041aeec;
  }
LAB_0041a8eb:
  pDVar21 = (this_00->baseWidget).wp.d;
  if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
    pQVar22 = (QObject *)0x0;
  }
  else {
    pQVar22 = (this_00->baseWidget).wp.value;
  }
  if ((pQVar22 == object) || (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) == 0)) {
LAB_0041aa0b:
    if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
      pQVar22 = (QObject *)0x0;
    }
    else {
      pQVar22 = (this_00->baseWidget).wp.value;
    }
    sVar1 = *(short *)(event + 8);
    if (pQVar22 == object) {
      if (sVar1 == 10) {
        this_00->currentOperation = None;
        QMdiSubWindowPrivate::updateCursor(this_00);
      }
      else if (sVar1 == 0x69) {
        cVar14 = QWindowStateChangeEvent::isOverride();
        if (cVar14 == '\0') {
          uVar3 = *(uint *)(event + 0x10);
          WVar18 = QWidget::windowState((QWidget *)(this_00->baseWidget).wp.value);
          if (((uVar3 & 1) == 0) &&
             (((uint)WVar18.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                     super_QFlagsStorage<Qt::WindowState>.i & 1) != 0)) {
            QWidget::showMinimized(&this->super_QWidget);
          }
          else if (((uVar3 & 2) == 0) &&
                  (((uint)WVar18.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                          super_QFlagsStorage<Qt::WindowState>.i & 2) != 0)) {
            QWidget::showMaximized(&this->super_QWidget);
          }
          else if (((uint)WVar18.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                          super_QFlagsStorage<Qt::WindowState>.i & 7) == 0) {
            QWidget::showNormal(&this->super_QWidget);
          }
        }
      }
      else if (sVar1 == 0x1a) {
        if (this_00->isWidgetHiddenByUs == false) {
          QWidget::show(&this->super_QWidget);
        }
      }
      else {
        if (sVar1 == 0x21) goto LAB_0041aa32;
        if (sVar1 == 0x4c) {
          QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
        }
        else if (sVar1 == 0x66) {
          if (pDVar21 != (Data *)0x0) {
            if (*(int *)(pDVar21 + 4) == 0) {
              pQVar22 = (QObject *)0x0;
            }
            else {
              pQVar22 = (this_00->baseWidget).wp.value;
            }
            if (pQVar22 == object) {
              bVar12 = QWidget::isWindowModified((QWidget *)(this_00->baseWidget).wp.value);
              if (!bVar12) {
                QWidget::windowTitle((QString *)&local_58,(QWidget *)(this_00->baseWidget).wp.value)
                ;
                QWidget::windowTitle((QString *)&local_70,&this->super_QWidget);
                bVar15 = ::operator!=((QString *)&local_58,(QString *)&local_70);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
                if (bVar15) goto LAB_0041aeec;
              }
              QWidget::windowTitle((QString *)&local_58,&this->super_QWidget);
              s.m_data = "[*]";
              s.m_size = 3;
              bVar15 = QString::contains((QString *)&local_58,s,CaseSensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
              if (bVar15) {
                QWidget::setWindowModified(&this->super_QWidget,bVar12);
              }
            }
          }
        }
        else if (sVar1 == 0x11) {
          QMdiSubWindowPrivate::setActive(this_00,true,true);
        }
      }
      goto LAB_0041aeec;
    }
    if (sVar1 != 0x21) goto LAB_0041aa5f;
LAB_0041aa32:
    if (this_00->ignoreWindowTitleChange == false) {
      if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
        pQVar22 = (QObject *)0x0;
      }
      else {
        pQVar22 = (this_00->baseWidget).wp.value;
      }
      if (pQVar22 == object) {
        QMdiSubWindowPrivate::updateWindowTitle(this_00,true);
        QWidget::windowTitle((QString *)&local_58,(QWidget *)(this_00->baseWidget).wp.value);
        pDVar7 = (this_00->lastChildWindowTitle).d.d;
        pcVar8 = (this_00->lastChildWindowTitle).d.ptr;
        (this_00->lastChildWindowTitle).d.d = local_58.d;
        (this_00->lastChildWindowTitle).d.ptr = local_58.ptr;
        qVar6 = (this_00->lastChildWindowTitle).d.size;
        (this_00->lastChildWindowTitle).d.size = local_58.size;
        local_58.d = pDVar7;
        local_58.ptr = pcVar8;
        local_58.size = qVar6;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      else {
        pQVar23 = maximizedButtonsWidget(this);
        if (pQVar23 != (QWidget *)0x0) {
          pDVar21 = (this_00->controlContainer).wp.d;
          if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
            pQVar22 = (QObject *)0x0;
          }
          else {
            pQVar22 = (this_00->controlContainer).wp.value;
          }
          if (((*(long *)(pQVar22 + 0x30) != 0) && (*(int *)(*(long *)(pQVar22 + 0x30) + 4) != 0))
             && (*(long *)(pQVar22 + 0x38) != 0)) {
            pQVar23 = QMenuBar::cornerWidget
                                (*(QMenuBar **)((this_00->controlContainer).wp.value + 0x38),
                                 TopRightCorner);
            pQVar25 = maximizedButtonsWidget(this);
            if (pQVar23 == pQVar25) {
              QString::clear(&this_00->originalTitle);
              bVar12 = QPointer::operator_cast_to_bool((QPointer *)&this_00->baseWidget);
              if (bVar12) {
                QWidget::windowTitle((QString *)&local_58,(QWidget *)(this_00->baseWidget).wp.value)
                ;
                QWidget::windowTitle((QString *)&local_70,&this->super_QWidget);
                bVar12 = ::comparesEqual((QString *)&local_58,(QString *)&local_70);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
                if (!bVar12) goto LAB_0041aee2;
                bVar12 = true;
              }
              else {
LAB_0041aee2:
                bVar12 = false;
              }
              QMdiSubWindowPrivate::updateWindowTitle(this_00,bVar12);
            }
          }
        }
      }
    }
LAB_0041aeec:
    uVar13 = QObject::eventFilter((QObject *)this,(QEvent *)object);
  }
  else {
    pQVar19 = QtPrivate::qobject_cast_helper<QSizeGrip*,QObject>(object);
    if (pQVar19 == (QSizeGrip *)0x0) {
      pDVar21 = (this_00->baseWidget).wp.d;
      goto LAB_0041aa0b;
    }
    if ((*(short *)(event + 8) != 2) ||
       (lVar4 = *(long *)&(this->super_QWidget).field_0x8, (*(byte *)(lVar4 + 0x388) & 4) == 0)) {
LAB_0041aa5f:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0041aa79:
        uVar13 = QObject::eventFilter((QObject *)this,(QEvent *)object);
        return (bool)uVar13;
      }
      goto LAB_0041af19;
    }
    pQVar23 = *(QWidget **)(lVar4 + 0x10);
    QVar27 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    local_58.d = (Data *)QVar27.xp;
    local_58.ptr = (char16_t *)QVar27.yp;
    local_70.d = (Data *)QPointF::toPoint((QPointF *)&local_58);
    QVar20 = QWidget::mapFromGlobal(pQVar23,(QPoint *)&local_70);
    this_00->mousePressPosition = QVar20;
    pQVar5 = (this->super_QWidget).data;
    RVar9.m_i = (pQVar5->crect).y1.m_i;
    RVar10.m_i = (pQVar5->crect).x2.m_i;
    RVar11.m_i = (pQVar5->crect).y2.m_i;
    (this_00->oldGeometry).x1 = (Representation)(pQVar5->crect).x1.m_i;
    (this_00->oldGeometry).y1 = (Representation)RVar9.m_i;
    (this_00->oldGeometry).x2 = (Representation)RVar10.m_i;
    (this_00->oldGeometry).y2 = (Representation)RVar11.m_i;
    bVar12 = QWidget::isLeftToRight(&this->super_QWidget);
    this_00->currentOperation = bVar12 | BottomLeftResize;
    QMdiSubWindowPrivate::enterRubberBandMode(this_00);
    uVar13 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar13;
  }
LAB_0041af19:
  __stack_chk_fail();
}

Assistant:

bool QMdiSubWindow::eventFilter(QObject *object, QEvent *event)
{
    Q_D(QMdiSubWindow);
    if (!object)
        return QWidget::eventFilter(object, event);

#if QT_CONFIG(menu)
    // System menu events.
    if (d->systemMenu && d->systemMenu == object) {
        if (event->type() == QEvent::MouseButtonDblClick) {
            const QMouseEvent *mouseEvent = static_cast<const QMouseEvent *>(event);
            const QAction *action = d->systemMenu->actionAt(mouseEvent->position().toPoint());
            if (!action || action->isEnabled())
                close();
        } else if (event->type() == QEvent::MouseMove) {
            QMouseEvent *mouseEvent = static_cast<QMouseEvent *>(event);
            d->hoveredSubControl = d->getSubControl(mapFromGlobal(mouseEvent->globalPosition().toPoint()));
        } else if (event->type() == QEvent::Hide) {
            d->activeSubControl = QStyle::SC_None;
            update(QRegion(0, 0, width(), d->titleBarHeight()));
        }
        return QWidget::eventFilter(object, event);
    }
#endif

#if QT_CONFIG(sizegrip)
    if (object != d->baseWidget && parent() && qobject_cast<QSizeGrip *>(object)) {
        if (event->type() != QEvent::MouseButtonPress || !testOption(QMdiSubWindow::RubberBandResize))
            return QWidget::eventFilter(object, event);
        const QMouseEvent *mouseEvent = static_cast<QMouseEvent *>(event);
        d->mousePressPosition = parentWidget()->mapFromGlobal(mouseEvent->globalPosition().toPoint());
        d->oldGeometry = geometry();
        d->currentOperation = isLeftToRight() ? QMdiSubWindowPrivate::BottomRightResize
                                              : QMdiSubWindowPrivate::BottomLeftResize;
#if QT_CONFIG(rubberband)
        d->enterRubberBandMode();
#endif
        return true;
    }
#endif

    if (object != d->baseWidget && event->type() != QEvent::WindowTitleChange)
        return QWidget::eventFilter(object, event);

    switch (event->type()) {
    case QEvent::Show:
        d->setActive(true);
        break;
    case QEvent::ShowToParent:
        if (!d->isWidgetHiddenByUs)
            show();
        break;
    case QEvent::WindowStateChange: {
        QWindowStateChangeEvent *changeEvent = static_cast<QWindowStateChangeEvent*>(event);
        if (changeEvent->isOverride())
            break;
        Qt::WindowStates oldState = changeEvent->oldState();
        Qt::WindowStates newState = d->baseWidget->windowState();
        if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized))
            showMinimized();
        else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized))
            showMaximized();
        else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized | Qt::WindowFullScreen)))
            showNormal();
        break;
    }
    case QEvent::Enter:
        d->currentOperation = QMdiSubWindowPrivate::None;
        d->updateCursor();
        break;
    case QEvent::LayoutRequest:
        d->updateGeometryConstraints();
        break;
    case QEvent::WindowTitleChange:
        if (d->ignoreWindowTitleChange)
            break;
        if (object == d->baseWidget) {
            d->updateWindowTitle(true);
            d->lastChildWindowTitle = d->baseWidget->windowTitle();
#if QT_CONFIG(menubar)
        } else if (maximizedButtonsWidget() && d->controlContainer->menuBar() && d->controlContainer->menuBar()
                   ->cornerWidget(Qt::TopRightCorner) == maximizedButtonsWidget()) {
            d->originalTitle.clear();
            if (d->baseWidget && d->baseWidget->windowTitle() == windowTitle())
                d->updateWindowTitle(true);
            else
                d->updateWindowTitle(false);
#endif
        }
        break;
    case QEvent::ModifiedChange: {
        if (object != d->baseWidget)
            break;
        bool windowModified = d->baseWidget->isWindowModified();
        if (!windowModified && d->baseWidget->windowTitle() != windowTitle())
            break;
        if (windowTitle().contains("[*]"_L1))
            setWindowModified(windowModified);
        break;
    }
    default:
        break;
    }
    return QWidget::eventFilter(object, event);
}